

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall
Object_SingleNumber_Test<wchar_t>::~Object_SingleNumber_Test
          (Object_SingleNumber_Test<wchar_t> *this)

{
  Object_SingleNumber_Test<wchar_t> *this_local;
  
  ~Object_SingleNumber_Test(this);
  operator_delete(this,0x188);
  return;
}

Assistant:

TYPED_TEST (Object, SingleNumber) {
    using namespace ::pstore::dump;
    object v{object::container{{"key", make_number (42)}}};
    v.write (this->out);
    auto const & actual = this->out.str ();
    EXPECT_THAT (split_tokens (actual),
                 ::testing::ElementsAre (convert<TypeParam> ("key"), convert<TypeParam> (":"),
                                         convert<TypeParam> ("0x2a")));
}